

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void mwInit(void)

{
  FILE *pFVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  time_t tid;
  time_t atStack_38 [4];
  
  iVar3 = mwInited;
  mwInited = mwInited + 1;
  if (0 < iVar3) {
    return;
  }
  pFVar1 = mwLogR();
  if (pFVar1 == (FILE *)0x0) {
    mwLogFile("memwatch.log");
  }
  pFVar1 = mwLogR();
  if (pFVar1 == (FILE *)0x0) {
    uVar4 = 1;
    do {
      iVar3 = (int)uVar4;
      sprintf((char *)atStack_38,"memwat%02d.log",uVar4);
      mwLogFile((char *)atStack_38);
      pFVar1 = mwLogR();
      if (pFVar1 != (FILE *)0x0) break;
      uVar4 = (ulong)(iVar3 + 1);
    } while (iVar3 != 99);
  }
  mwStatList = (mwStat *)0x0;
  mwStatTotAlloc = 0;
  mwStatCurAlloc = 0;
  mwStatMaxAlloc = 0;
  mwStatNumAlloc = 0;
  mwNmlCurAlloc = 0;
  mwNmlNumAlloc = 0;
  mwDataSize = 1;
  if (mwInfoWritten == '\0') {
    mwInfoWritten = '\x01';
    time(atStack_38);
    mwWrite("\n============= MEMWATCH 2.71 Copyright (C) 1992-1999 Johan Lindh =============\n");
    pcVar2 = ctime(atStack_38);
    mwWrite("\nStarted at %s\n",pcVar2);
    mwWrite("Modes: ");
    mwWrite("__STDC__ ");
    mwWrite("64-bit ");
    mwWrite("mwDWORD==(unsigned int)\n");
    mwWrite("mwROUNDALLOC==%d sizeof(mwData)==%d mwDataSize==%d\n",8,0x38,0x38);
    mwWrite("\n");
    mwFlush();
  }
  if (mwUseAtexit == '\x01') {
    atexit(mwAbort);
  }
  return;
}

Assistant:

void mwInit(void)
{
	time_t tid;

	if (mwInited++ > 0) {
		return;
	}

	MW_MUTEX_INIT();

	/* start a log if none is running */
	if (mwLogR() == NULL) {
		mwLogFile("memwatch.log");
	}
	if (mwLogR() == NULL) {
		int i;
		char buf[32];
		/* oops, could not open it! */
		/* probably because it's already open */
		/* so we try some other names */
		for (i = 1; i < 100; i++) {
			sprintf(buf, "memwat%02d.log", i);
			mwLogFile(buf);
			if (mwLogR() != NULL) {
				break;
			}
		}
	}

	/* initialize the statistics */
	mwStatList = NULL;
	mwStatTotAlloc = 0L;
	mwStatCurAlloc = 0L;
	mwStatMaxAlloc = 0L;
	mwStatNumAlloc = 0L;
	mwNmlCurAlloc = 0L;
	mwNmlNumAlloc = 0L;

	/* calculate the buffer size to use for a mwData */
	mwDataSize = sizeof(mwData);
	while (mwDataSize % mwROUNDALLOC) {
		mwDataSize ++;
	}

	/* write informational header if needed */
	if (!mwInfoWritten) {
		mwInfoWritten = 1;
		(void) time(&tid);
		mwWrite(
			"\n============="
			" MEMWATCH " VERSION " Copyright (C) 1992-1999 Johan Lindh "
			"=============\n");
		mwWrite("\nStarted at %s\n", ctime(&tid));

		/**************************************************************** Generic */
		mwWrite("Modes: ");
#ifdef mwNew
		mwWrite("C++ ");
#endif /* mwNew */
#ifdef __STDC__
		mwWrite("__STDC__ ");
#endif /* __STDC__ */
#ifdef mw16BIT
		mwWrite("16-bit ");
#endif
#ifdef mw32BIT
		mwWrite("32-bit ");
#endif
#ifdef mw64BIT
		mwWrite("64-bit ");
#endif
		mwWrite("mwDWORD==(" mwDWORD_DEFINED ")\n");
		mwWrite("mwROUNDALLOC==%d sizeof(mwData)==%d mwDataSize==%d\n",
				mwROUNDALLOC, sizeof(mwData), mwDataSize);
		/**************************************************************** Generic */

		/************************************************************ Microsoft C */
#ifdef _MSC_VER
		mwWrite("Compiled using Microsoft C" CPPTEXT
				" %d.%02d\n", _MSC_VER / 100, _MSC_VER % 100);
#endif /* _MSC_VER */
		/************************************************************ Microsoft C */

		/************************************************************** Borland C */
#ifdef __BORLANDC__
		mwWrite("Compiled using Borland C"
#ifdef __cplusplus
				"++ %d.%01d\n", __BCPLUSPLUS__ / 0x100, (__BCPLUSPLUS__ % 0x100) / 0x10);
#else
				" %d.%01d\n", __BORLANDC__ / 0x100, (__BORLANDC__ % 0x100) / 0x10);
#endif /* __cplusplus */
#endif /* __BORLANDC__ */
		/************************************************************** Borland C */

		/************************************************************** Watcom C */
#ifdef __WATCOMC__
		mwWrite("Compiled using Watcom C %d.%02d ",
				__WATCOMC__ / 100, __WATCOMC__ % 100);
#ifdef __FLAT__
		mwWrite("(32-bit flat model)");
#endif /* __FLAT__ */
		mwWrite("\n");
#endif /* __WATCOMC__ */
		/************************************************************** Watcom C */

		mwWrite("\n");
		FLUSH();
	}

	if (mwUseAtexit) {
		(void) atexit(mwAbort);
	}
	return;
}